

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O0

TPZAutoPointer<TPZMatrix<Fad<long_double>_>_>
TPZAutoPointerDynamicCast<TPZMatrix<Fad<long_double>>,TPZBaseMatrix>
          (TPZAutoPointer<TPZBaseMatrix> *in)

{
  undefined8 *in_RSI;
  TPZReference *in_RDI;
  TPZMatrix<Fad<long_double>_> *p;
  TPZAutoPointer<TPZMatrix<Fad<long_double>_>_> *rv;
  TPZReference *this;
  long local_48;
  TPZReference *pTVar1;
  
  pTVar1 = in_RDI;
  TPZAutoPointer<TPZMatrix<Fad<long_double>_>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<Fad<long_double>_>_> *)in_RDI);
  if (*(long *)*in_RSI == 0) {
    local_48 = 0;
  }
  else {
    local_48 = __dynamic_cast(*(long *)*in_RSI,&TPZBaseMatrix::typeinfo,
                              &TPZMatrix<Fad<long_double>>::typeinfo,0);
  }
  if (local_48 != 0) {
    this = (TPZReference *)pTVar1->fPointer;
    if (this != (TPZReference *)0x0) {
      TPZAutoPointer<TPZMatrix<Fad<long_double>_>_>::TPZReference::~TPZReference(this);
      operator_delete(this,0x10);
    }
    pTVar1->fPointer = (TPZMatrix<Fad<long_double>_> *)*in_RSI;
    TPZAutoPointer<TPZMatrix<Fad<long_double>_>_>::TPZReference::Increment
              ((TPZReference *)pTVar1->fPointer);
  }
  return (TPZAutoPointer<TPZMatrix<Fad<long_double>_>_>)in_RDI;
}

Assistant:

TPZAutoPointer<R> TPZAutoPointerDynamicCast(TPZAutoPointer<T> in) {
    TPZAutoPointer<R> rv;
    if (R* p; (p = dynamic_cast<R*> (in.fRef->fPointer)) ) {
        delete rv.fRef;
        rv.fRef = (typename TPZAutoPointer<R>::TPZReference *) in.fRef;
        rv.fRef->Increment();
    }
    return rv;
}